

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

Cba_Man_t * Cba_ManExtractGroup(Cba_Man_t *p,Vec_Int_t *vObjs)

{
  int nOuts;
  uint uVar1;
  Hash_IntMan_t *vHash;
  Vec_Int_t *pVVar2;
  int iVar3;
  Abc_Nam_t *pAVar4;
  Abc_Nam_t *pFuns;
  Abc_Nam_t *pMods;
  Cba_Man_t *p_00;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  Cba_Ntk_t *pNew;
  char *pcVar7;
  int *piVar8;
  Cba_Ntk_t *p_01;
  int nFons;
  int nFins;
  int local_54;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  int local_38;
  int local_34;
  
  pcVar7 = p->pSpec;
  local_50 = vObjs;
  pAVar4 = Abc_NamRef(p->pStrs);
  pFuns = Abc_NamRef(p->pFuns);
  pMods = Abc_NamStart(100,0x18);
  vHash = p->vHash;
  piVar8 = &vHash->nRefs;
  *piVar8 = *piVar8 + 1;
  p_00 = Cba_ManAlloc(pcVar7,1,pAVar4,pFuns,pMods,vHash);
  pVVar2 = local_50;
  iVar3 = p->iRoot;
  if (((long)iVar3 < 1) || ((p->vNtks).nSize <= iVar3)) {
    p_01 = (Cba_Ntk_t *)0x0;
  }
  else {
    p_01 = (Cba_Ntk_t *)(p->vNtks).pArray[iVar3];
  }
  pVVar5 = Cba_NtkCollectInFons(p_01,local_50);
  pVVar6 = Cba_NtkCollectOutFons(p_01,pVVar2);
  memcpy(p_00->pTypeNames,p->pTypeNames,0x2d0);
  Cba_NtkCollectGroupStats(p_01,pVVar2,&local_38,&local_54);
  iVar3 = pVVar5->nSize;
  nOuts = pVVar6->nSize;
  local_38 = local_38 + nOuts;
  local_54 = local_54 + iVar3;
  local_48 = pVVar5;
  local_40 = pVVar6;
  pNew = Cba_NtkAlloc(p_00,p_01->NameId,iVar3,nOuts,pVVar2->nSize + iVar3 + nOuts,local_38,local_54)
  ;
  pAVar4 = p_00->pMods;
  pcVar7 = Abc_NamStr(pNew->pDesign->pStrs,pNew->NameId);
  iVar3 = Abc_NamStrFindOrAdd(pAVar4,pcVar7,&local_34);
  if (local_34 == 0) {
    if (iVar3 != pNew->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                    ,0x264,"void Cba_NtkAdd(Cba_Man_t *, Cba_Ntk_t *)");
    }
  }
  else {
    Abc_NamStr(pNew->pDesign->pStrs,pNew->NameId);
    printf("Network with name \"%s\" already exists.\n");
  }
  if (0 < (p_01->vObjName).nSize) {
    uVar1 = (pNew->vObjType).nCap;
    if ((pNew->vObjName).nCap < (int)uVar1) {
      piVar8 = (pNew->vObjName).pArray;
      if (piVar8 == (int *)0x0) {
        piVar8 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
      }
      (pNew->vObjName).pArray = piVar8;
      if (piVar8 == (int *)0x0) goto LAB_00339065;
      (pNew->vObjName).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((pNew->vObjName).pArray,0,(ulong)uVar1 * 4);
    }
    (pNew->vObjName).nSize = uVar1;
  }
  if (0 < (p_01->vFonName).nSize) {
    uVar1 = (pNew->vFonObj).nCap;
    if ((pNew->vFonName).nCap < (int)uVar1) {
      piVar8 = (pNew->vFonName).pArray;
      if (piVar8 == (int *)0x0) {
        piVar8 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
      }
      (pNew->vFonName).pArray = piVar8;
      if (piVar8 == (int *)0x0) {
LAB_00339065:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNew->vFonName).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((pNew->vFonName).pArray,0,(ulong)uVar1 * 4);
    }
    (pNew->vFonName).nSize = uVar1;
  }
  pVVar5 = local_40;
  pVVar2 = local_48;
  Cba_ManExtractGroupInt(pNew,p_01,local_50,local_48,local_40);
  Cba_NtkMissingFonNames(pNew,"b");
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (int *)0x0;
  }
  if (pVVar5 != (Vec_Int_t *)0x0) {
    free(pVVar5);
  }
  return p_00;
}

Assistant:

Cba_Man_t * Cba_ManExtractGroup( Cba_Man_t * p, Vec_Int_t * vObjs )
{
    Cba_Man_t * pNew  = Cba_ManAlloc( p->pSpec, 1, Abc_NamRef(p->pStrs), Abc_NamRef(p->pFuns), Abc_NamStart(100, 24), Hash_IntManRef(p->vHash) );
    Cba_Ntk_t * pRoot = Cba_ManRoot( p ), * pRootNew;
    Vec_Int_t * vFonIns = Cba_NtkCollectInFons( pRoot, vObjs );
    Vec_Int_t * vFonOuts = Cba_NtkCollectOutFons( pRoot, vObjs );
    int nObjs, nFins, nFons;
    Cba_ManDupTypeNames( pNew, p );
    // collect stats
    Cba_NtkCollectGroupStats( pRoot, vObjs, &nFins, &nFons );
    nObjs  = Vec_IntSize(vObjs) + Vec_IntSize(vFonIns) + Vec_IntSize(vFonOuts);
    nFins += Vec_IntSize(vFonOuts);
    nFons += Vec_IntSize(vFonIns);
    // create network
    pRootNew = Cba_NtkAlloc( pNew, Cba_NtkNameId(pRoot), Vec_IntSize(vFonIns), Vec_IntSize(vFonOuts), nObjs, nFins, nFons );
    Cba_NtkAdd( pNew, pRootNew );
    if ( Cba_NtkHasObjNames(pRoot) )
        Cba_NtkCleanObjNames( pRootNew );
    if ( Cba_NtkHasFonNames(pRoot) )
        Cba_NtkCleanFonNames( pRootNew );
    // add group nodes
    Cba_ManExtractGroupInt( pRootNew, pRoot, vObjs, vFonIns, vFonOuts );
    Cba_NtkMissingFonNames( pRootNew, "b" );
    //Cba_NtkPrepareSeq( pRootNew );
    // cleanup
    Vec_IntFree( vFonIns );
    Vec_IntFree( vFonOuts );
    return pNew;
}